

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

int __thiscall MPLSParser::composeSTN_tableSS(MPLSParser *this,uint8_t *buffer,int bufferSize)

{
  int *this_00;
  int iVar1;
  MPLSStreamInfo *other;
  size_type sVar2;
  ulong local_d0;
  size_t PlayItem_id;
  undefined1 local_b8 [8];
  MPLSStreamInfo streamInfoMVC;
  BitStreamWriter writer;
  int bufferSize_local;
  uint8_t *buffer_local;
  MPLSParser *this_local;
  
  this_00 = &streamInfoMVC.pipParams.lumma;
  BitStreamWriter::BitStreamWriter((BitStreamWriter *)this_00);
  BitStreamWriter::setBuffer((BitStreamWriter *)this_00,buffer,buffer + bufferSize);
  other = getMVCDependStream(this);
  MPLSStreamInfo::MPLSStreamInfo((MPLSStreamInfo *)local_b8,other);
  local_d0 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
            ::size((vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                    *)streamInfoMVC.super_M2TSStreamInfo.language_code);
    if (sVar2 <= local_d0) break;
    composeSTN_table(this,(BitStreamWriter *)&streamInfoMVC.pipParams.lumma,local_d0,true);
    local_d0 = local_d0 + 1;
  }
  BitStreamWriter::flushBits((BitStreamWriter *)&streamInfoMVC.pipParams.lumma);
  iVar1 = BitStreamWriter::getBitsCount((BitStreamWriter *)&streamInfoMVC.pipParams.lumma);
  MPLSStreamInfo::~MPLSStreamInfo((MPLSStreamInfo *)local_b8);
  return iVar1 / 8;
}

Assistant:

int MPLSParser::composeSTN_tableSS(uint8_t* buffer, const int bufferSize)
{
    BitStreamWriter writer{};
    writer.setBuffer(buffer, buffer + bufferSize);
    try
    {
        const MPLSStreamInfo streamInfoMVC = getMVCDependStream();
        for (size_t PlayItem_id = 0; PlayItem_id < streamInfoMVC.m_index.size(); PlayItem_id++)
        {
            composeSTN_table(writer, PlayItem_id, true);
            // connection_condition = 6;
        }
        writer.flushBits();
        return writer.getBitsCount() / 8;
    }
    catch (...)
    {
        return 0;
    }
}